

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-reader.h
# Opt level: O0

bool __thiscall
mp::internal::TextReader<fmt::Locale>::DoReadOptionalInt<int>
          (TextReader<fmt::Locale> *this,int *value)

{
  bool bVar1;
  TextReader<fmt::Locale> *in_RSI;
  uint *in_RDI;
  UInt max;
  UInt result;
  char sign;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  BasicCStringRef<char> local_30;
  uint local_24;
  uint local_20;
  char local_19;
  CStringRef arg0;
  undefined7 in_stack_fffffffffffffff8;
  undefined1 in_stack_ffffffffffffffff;
  
  arg0.data_ = (char *)in_RDI;
  SkipSpace((TextReader<fmt::Locale> *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0)
           );
  local_19 = **(char **)in_RDI;
  if ((local_19 == '+') || (local_19 == '-')) {
    *(long *)in_RDI = *(long *)in_RDI + 1;
  }
  local_20 = 0;
  bVar1 = ReadIntWithoutSign<unsigned_int>
                    ((TextReader<fmt::Locale> *)
                     CONCAT17(in_stack_ffffffffffffffff,in_stack_fffffffffffffff8),
                     (uint *)arg0.data_);
  if (bVar1) {
    local_24 = std::numeric_limits<int>::max();
    if ((local_24 < local_20) && ((local_19 != '-' || (local_20 != local_24 + 1)))) {
      fmt::BasicCStringRef<char>::BasicCStringRef(&local_30,"number is too big");
      ReportError<>(in_RSI,arg0);
    }
    if (local_19 == '-') {
      local_20 = -local_20;
    }
    *(uint *)&(in_RSI->super_ReaderBase).ptr_ = local_20;
    bVar1 = true;
  }
  else {
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool DoReadOptionalInt(Int &value) {
    SkipSpace();
    char sign = *ptr_;
    if (sign == '+' || sign == '-')
      ++ptr_;
    typedef typename MakeUnsigned<Int>::Type UInt;
    UInt result = 0;
    if (!ReadIntWithoutSign<UInt>(result))
      return false;
    UInt max = std::numeric_limits<Int>::max();
    if (result > max && !(sign == '-' && result == max + 1))
      ReportError("number is too big");
    value = sign != '-' ? result : 0 - result;
    return true;
  }